

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O2

void __thiscall
ser::Serializer::WriteField
          (Serializer *this,string *fieldName,Savepoint *savepoint,void *pData,int iStride,
          int jStride,int kStride,int lStride)

{
  OffsetTable *this_00;
  StellaOutputProxy *pSVar1;
  ostream *poVar2;
  SerializationException *pSVar3;
  int local_2ac;
  string checksum;
  vector<char,_std::allocator<char>_> binaryData;
  offset_t offset;
  void *pData_local;
  DataFieldInfo *local_238;
  ostringstream errorstr;
  
  if (enabled_ < 0) {
    return;
  }
  pData_local = pData;
  stella::detail::StellaOutput::operator<<((StellaOutput *)&checksum,(char (*) [15])&sout);
  pSVar1 = stella::detail::StellaOutputProxy::operator<<((StellaOutputProxy *)&checksum,fieldName);
  pSVar1 = stella::detail::StellaOutputProxy::operator<<(pSVar1,(char (*) [15])0x131cbb);
  Savepoint::ToString_abi_cxx11_((string *)&errorstr,savepoint);
  pSVar1 = stella::detail::StellaOutputProxy::operator<<
                     (pSVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &errorstr);
  pSVar1 = stella::detail::StellaOutputProxy::operator<<(pSVar1,(char (*) [15])" with data at ");
  pSVar1 = stella::detail::StellaOutputProxy::operator<<(pSVar1,&pData_local);
  stella::detail::StellaOutputProxy::operator<<(pSVar1,(char (*) [2])0x131924);
  std::__cxx11::string::~string((string *)&errorstr);
  if (this->mode_ - SerializerOpenModeWrite < 2) {
    local_238 = FieldsTable::Find(&this->fieldsTable_,fieldName);
    this_00 = &this->offsetTable_;
    local_2ac = OffsetTable::GetSavepointID(this_00,savepoint);
    if (local_2ac < 0) {
      local_2ac = OffsetTable::AddNewSavepoint(this_00,savepoint,-1);
    }
    OffsetTable::GetOffset(this_00,local_2ac,fieldName);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorstr);
    poVar2 = std::operator<<((ostream *)&errorstr,"Error: field ");
    poVar2 = std::operator<<(poVar2,(string *)fieldName);
    poVar2 = std::operator<<(poVar2," was already saved into ");
    poVar2 = std::operator<<(poVar2,"serializer at savepoint ");
    Savepoint::ToString_abi_cxx11_(&checksum,savepoint);
    std::operator<<(poVar2,(string *)&checksum);
    std::__cxx11::string::~string((string *)&checksum);
    checksum._M_dataplus._M_p = (pointer)&PTR__SerializationException_0013e790;
    checksum._M_string_length = (long)&checksum.field_2 + 8;
    checksum.field_2._M_allocated_capacity = 0;
    checksum.field_2._M_local_buf[8] = '\0';
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&checksum._M_string_length);
    std::__cxx11::string::~string((string *)&binaryData);
    pSVar3 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(pSVar3,(SerializationException *)&checksum);
    __cxa_throw(pSVar3,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorstr);
  std::operator<<((ostream *)&errorstr,
                  "Error: serializer not open in write mode, but write operation requested.");
  checksum._M_string_length = (long)&checksum.field_2 + 8;
  checksum._M_dataplus._M_p = (pointer)&PTR__SerializationException_0013e790;
  checksum.field_2._M_allocated_capacity = 0;
  checksum.field_2._M_local_buf[8] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&checksum._M_string_length);
  std::__cxx11::string::~string((string *)&binaryData);
  pSVar3 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(pSVar3,(SerializationException *)&checksum);
  __cxa_throw(pSVar3,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

void Serializer::WriteField(const std::string& fieldName, const Savepoint& savepoint,
        const void* pData, int iStride, int jStride, int kStride, int lStride)
{
    // Don't write if serialization is disabeld
    if (enabled_ < 0) return;

    sout << "Writing field " << fieldName << " at savepoint " << savepoint.ToString()
         << " with data at " << pData << "\n";

    // Check open mode
    if (mode_ != SerializerOpenModeWrite && mode_ != SerializerOpenModeAppend)
    {
        // Throw exception
        std::ostringstream errorstr;
        errorstr << "Error: serializer not open in write mode, but write operation requested.";
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    // Retrieve field info
    // (It will throw an exception if the field is not yet registered)
    const DataFieldInfo& info = fieldsTable_.Find(fieldName);

    // Search savepoint or add a new one if not present
    int savepointID = offsetTable_.GetSavepointID(savepoint);
    if (savepointID < 0)
        savepointID = offsetTable_.AddNewSavepoint(savepoint);

    // Check if field is already saved at savepoint
    try
    {
        offsetTable_.GetOffset(savepointID, fieldName);

        // Field is already there: throw exception
        std::ostringstream errorstr;
        errorstr << "Error: field " << fieldName << " was already saved into "
            << "serializer at savepoint " << savepoint.ToString();
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }
    catch (SerializationException&)
    {
        // Field is not there (or savepoint does not exist)
        // No error, continue
    }

    // Obtain buffer and checksum
    std::vector<char> binaryData;
    const std::string checksum = binarySerializer_.WriteArray(pData, info.bytesPerElement(),
            info.iSize(), info.jSize(), info.kSize(), info.lSize(),
            iStride, jStride, kStride, lStride, binaryData);

    // Check in offset table if data must be stored
    OffsetTable::offset_t offset;
    if (!offsetTable_.AlreadySerialized(fieldName, checksum, offset))
    {
        // Record is not found: we need to write the data
        // Open file stream
        std::ofstream fs;
        offset = pFileFormat_->OpenStreamAppend(fs, fieldName, savepoint);

        // Write data and close stream
        fs.write(binaryData.data(), binaryData.size());
        fs.close();
    }

    // Update tables
    offsetTable_.AddFieldRecord(savepointID, fieldName, offset, checksum);
    pFileFormat_->WriteTables(fieldName);
}